

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

void init_ref_map_pair(AV1_COMP *cpi,RefFrameMapPair *ref_frame_map_pairs)

{
  int *piVar1;
  void *in_RSI;
  long *in_RDI;
  RefCntBuffer *buf2;
  int idx2;
  RefCntBuffer *buf;
  int map_idx;
  int local_24;
  int local_14;
  
  if (*(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\0') {
    memset(in_RSI,0xff,0x40);
  }
  else {
    memset(in_RSI,0,0x40);
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      piVar1 = (int *)in_RDI[(long)local_14 + 0x7824];
      if (*(int *)((long)in_RSI + (long)local_14 * 8 + 4) != -1) {
        if (piVar1 == (int *)0x0) {
          *(undefined4 *)((long)in_RSI + (long)local_14 * 8 + 4) = 0xffffffff;
          *(undefined4 *)((long)in_RSI + (long)local_14 * 8) = 0xffffffff;
        }
        else {
          local_24 = local_14;
          if (1 < *piVar1) {
            while (local_24 = local_24 + 1, local_24 < 8) {
              if ((int *)in_RDI[(long)local_24 + 0x7824] == piVar1) {
                *(undefined4 *)((long)in_RSI + (long)local_24 * 8 + 4) = 0xffffffff;
                *(undefined4 *)((long)in_RSI + (long)local_24 * 8) = 0xffffffff;
              }
            }
          }
          *(int *)((long)in_RSI + (long)local_14 * 8 + 4) = piVar1[9];
          *(int *)((long)in_RSI + (long)local_14 * 8) = piVar1[0x11];
        }
      }
    }
  }
  return;
}

Assistant:

static inline void init_ref_map_pair(
    AV1_COMP *cpi, RefFrameMapPair ref_frame_map_pairs[REF_FRAMES]) {
  if (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == KF_UPDATE) {
    memset(ref_frame_map_pairs, -1, sizeof(*ref_frame_map_pairs) * REF_FRAMES);
    return;
  }
  memset(ref_frame_map_pairs, 0, sizeof(*ref_frame_map_pairs) * REF_FRAMES);
  for (int map_idx = 0; map_idx < REF_FRAMES; map_idx++) {
    // Get reference frame buffer.
    const RefCntBuffer *const buf = cpi->common.ref_frame_map[map_idx];
    if (ref_frame_map_pairs[map_idx].disp_order == -1) continue;
    if (buf == NULL) {
      ref_frame_map_pairs[map_idx].disp_order = -1;
      ref_frame_map_pairs[map_idx].pyr_level = -1;
      continue;
    } else if (buf->ref_count > 1) {
      // Once the keyframe is coded, the slots in ref_frame_map will all
      // point to the same frame. In that case, all subsequent pointers
      // matching the current are considered "free" slots. This will find
      // the next occurrence of the current pointer if ref_count indicates
      // there are multiple instances of it and mark it as free.
      for (int idx2 = map_idx + 1; idx2 < REF_FRAMES; ++idx2) {
        const RefCntBuffer *const buf2 = cpi->common.ref_frame_map[idx2];
        if (buf2 == buf) {
          ref_frame_map_pairs[idx2].disp_order = -1;
          ref_frame_map_pairs[idx2].pyr_level = -1;
        }
      }
    }
    ref_frame_map_pairs[map_idx].disp_order = (int)buf->display_order_hint;
    ref_frame_map_pairs[map_idx].pyr_level = buf->pyramid_level;
  }
}